

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc.cpp
# Opt level: O0

bool __thiscall Moc::until(Moc *this,Token target)

{
  const_reference pSVar1;
  qsizetype qVar2;
  Token in_ESI;
  QList<Symbol> *in_RDI;
  Token t;
  qsizetype possible;
  int angleCount;
  int parenCount;
  int brackCount;
  int braceCount;
  ulong in_stack_ffffffffffffffa8;
  QList<Symbol> *in_stack_ffffffffffffffb0;
  QList<Symbol> *this_00;
  Token local_34;
  Data *local_30;
  int local_24;
  int local_20;
  int local_1c;
  int local_18;
  bool local_1;
  
  local_18 = 0;
  local_1c = 0;
  local_20 = 0;
  local_24 = 0;
  if (in_RDI[1].d.d != (Data *)0x0) {
    pSVar1 = QList<Symbol>::at(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    switch(pSVar1->token) {
    case LANGLE:
      local_24 = 1;
      break;
    default:
      break;
    case LPAREN:
      local_20 = 1;
      break;
    case LBRACK:
      local_1c = 1;
      break;
    case LBRACE:
      local_18 = 1;
    }
  }
  local_30 = (Data *)0xffffffffffffffff;
  do {
    this_00 = (QList<Symbol> *)in_RDI[1].d.d;
    qVar2 = QList<Symbol>::size(in_RDI);
    if (qVar2 <= (long)this_00) break;
    in_RDI[1].d.d =
         (Data *)((long)&((in_RDI[1].d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                         _M_i + 1);
    pSVar1 = QList<Symbol>::at(this_00,in_stack_ffffffffffffffa8);
    local_34 = pSVar1->token;
    in_stack_ffffffffffffffa8 = (ulong)(local_34 - LANGLE);
    switch(in_stack_ffffffffffffffa8) {
    case 0:
      if ((local_20 == 0) && (local_18 == 0)) {
        local_24 = local_24 + 1;
      }
      break;
    case 1:
      if ((local_20 == 0) && (local_18 == 0)) {
        local_24 = local_24 + -1;
      }
      break;
    case 2:
      local_20 = local_20 + 1;
      break;
    case 3:
      local_20 = local_20 + -1;
      break;
    default:
      break;
    case 5:
      local_1c = local_1c + 1;
      break;
    case 6:
      local_1c = local_1c + -1;
      break;
    case 7:
      local_18 = local_18 + 1;
      break;
    case 8:
      local_18 = local_18 + -1;
      break;
    case 0x49:
      if ((local_20 == 0) && (local_18 == 0)) {
        local_24 = local_24 + -2;
        local_34 = PP_RANGLE;
      }
    }
    if (((((local_34 == in_ESI) && (local_18 < 1)) && (local_1c < 1)) && (local_20 < 1)) &&
       ((in_ESI != PP_RANGLE || (local_24 < 1)))) {
      if ((in_ESI != COMMA) || (local_24 < 1)) {
        return true;
      }
      local_30 = in_RDI[1].d.d;
    }
    if (((in_ESI == COMMA) && (local_34 == EQ)) && (local_30 != (Data *)0xffffffffffffffff)) {
      in_RDI[1].d.d = local_30;
      return true;
    }
    if ((((local_18 < 0) || (local_1c < 0)) || (local_20 < 0)) ||
       ((in_ESI == PP_RANGLE && (local_24 < 0)))) {
      in_RDI[1].d.d = (Data *)((long)&in_RDI[1].d.d[-1].super_QArrayData.alloc + 7);
      break;
    }
  } while ((0 < local_18) || (local_34 != SEMIC));
  if ((in_ESI == COMMA) && ((local_24 != 0 && (local_30 != (Data *)0xffffffffffffffff)))) {
    in_RDI[1].d.d = local_30;
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool Moc::until(Token target) {
    int braceCount = 0;
    int brackCount = 0;
    int parenCount = 0;
    int angleCount = 0;
    if (index) {
        switch(symbols.at(index-1).token) {
        case LBRACE: ++braceCount; break;
        case LBRACK: ++brackCount; break;
        case LPAREN: ++parenCount; break;
        case LANGLE: ++angleCount; break;
        default: break;
        }
    }

    //when searching commas within the default argument, we should take care of template depth (anglecount)
    // unfortunately, we do not have enough semantic information to know if '<' is the operator< or
    // the beginning of a template type. so we just use heuristics.
    qsizetype possible = -1;

    while (index < symbols.size()) {
        Token t = symbols.at(index++).token;
        switch (t) {
        case LBRACE: ++braceCount; break;
        case RBRACE: --braceCount; break;
        case LBRACK: ++brackCount; break;
        case RBRACK: --brackCount; break;
        case LPAREN: ++parenCount; break;
        case RPAREN: --parenCount; break;
        case LANGLE:
            if (parenCount == 0 && braceCount == 0)
                ++angleCount;
          break;
        case RANGLE:
            if (parenCount == 0 && braceCount == 0)
                --angleCount;
          break;
        case GTGT:
            if (parenCount == 0 && braceCount == 0) {
                angleCount -= 2;
                t = RANGLE;
            }
            break;
        default: break;
        }
        if (t == target
            && braceCount <= 0
            && brackCount <= 0
            && parenCount <= 0
            && (target != RANGLE || angleCount <= 0)) {
            if (target != COMMA || angleCount <= 0)
                return true;
            possible = index;
        }

        if (target == COMMA && t == EQ && possible != -1) {
            index = possible;
            return true;
        }

        if (braceCount < 0 || brackCount < 0 || parenCount < 0
            || (target == RANGLE && angleCount < 0)) {
            --index;
            break;
        }

        if (braceCount <= 0 && t == SEMIC) {
            // Abort on semicolon. Allow recovering bad template parsing (QTBUG-31218)
            break;
        }
    }

    if (target == COMMA && angleCount != 0 && possible != -1) {
        index = possible;
        return true;
    }

    return false;
}